

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O2

void __thiscall Test_DeathSTREQ_logging::Test_DeathSTREQ_logging(Test_DeathSTREQ_logging *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  ___std__vector<void(*)(),std::allocator<void(*)()>>__emplace_back<void(*)()>_void_________
            (&google::g_testlist,&local_8);
  return;
}

Assistant:

TEST(DeathSTREQ, logging) {
  ASSERT_DEATH(CHECK_STREQ(NULL, "this"), "");
  ASSERT_DEATH(CHECK_STREQ("this", "siht"), "");
  ASSERT_DEATH(CHECK_STRCASEEQ(NULL, "siht"), "");
  ASSERT_DEATH(CHECK_STRCASEEQ("this", "siht"), "");
  ASSERT_DEATH(CHECK_STRNE(NULL, NULL), "");
  ASSERT_DEATH(CHECK_STRNE("this", "this"), "");
  ASSERT_DEATH(CHECK_STREQ((string("a")+"b").c_str(), "abc"), "");
}